

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode_utils.hpp
# Opt level: O2

void duckdb::ParquetDecodeUtils::BitUnpack<unsigned_int>
               (ByteBuffer *src,bitpacking_width_t *bitpack_pos,uint *dst,idx_t count,
               bitpacking_width_t width)

{
  undefined8 uVar1;
  data_ptr_t pdVar2;
  byte bVar3;
  ulong uVar4;
  uint uVar5;
  undefined7 in_register_00000081;
  
  uVar4 = CONCAT71(in_register_00000081,width) & 0xffffffff;
  CheckWidth(width);
  uVar1 = *(undefined8 *)(BITPACK_MASKS + uVar4 * 8);
  ByteBuffer::available(src,(uVar4 * count) / 8);
  if ((0x1f < count) && (*bitpack_pos == '\0')) {
    BitUnpackAlignedInternal<unsigned_int>(src,dst,count & 0xffffffffffffffe0,width);
    dst = dst + (count & 0xffffffffffffffe0);
    count = (ulong)((uint)count & 0x1f);
  }
  for (uVar4 = 0; uVar4 != count; uVar4 = uVar4 + 1) {
    uVar5 = (uint)(*src->ptr >> (*bitpack_pos & 0x1f)) & (uint)uVar1;
    bVar3 = *bitpack_pos + width;
    while (*bitpack_pos = bVar3, 8 < bVar3) {
      src->len = src->len - 1;
      pdVar2 = src->ptr;
      src->ptr = pdVar2 + 1;
      uVar5 = uVar5 | (uint)pdVar2[1] << ((width + '\b') - *bitpack_pos & 0x1f) & (uint)uVar1;
      bVar3 = *bitpack_pos - 8;
    }
    dst[uVar4] = uVar5;
  }
  return;
}

Assistant:

static void BitUnpack(ByteBuffer &src, bitpacking_width_t &bitpack_pos, T *dst, idx_t count,
	                      const bitpacking_width_t width) {
		CheckWidth(width);
		const auto mask = BITPACK_MASKS[width];
		src.available(count * width / BITPACK_DLEN); // check if buffer has enough space available once
		if (bitpack_pos == 0 && count >= BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE) {
			idx_t remainder = count % BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE;
			idx_t aligned_count = count - remainder;
			BitUnpackAlignedInternal(src, dst, aligned_count, width);
			dst += aligned_count;
			count = remainder;
		}
		for (idx_t i = 0; i < count; i++) {
			auto val = (src.unsafe_get<uint8_t>() >> bitpack_pos) & mask;
			bitpack_pos += width;
			while (bitpack_pos > BITPACK_DLEN) {
				src.unsafe_inc(1);
				val |= (static_cast<T>(src.unsafe_get<uint8_t>())
				        << static_cast<T>(BITPACK_DLEN - (bitpack_pos - width))) &
				       mask;
				bitpack_pos -= BITPACK_DLEN;
			}
			dst[i] = val;
		}
	}